

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

HANDLE OpenMutexA(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCSTR lpName)

{
  DWORD local_2c;
  PAL_ERROR palError;
  CPalThread *pthr;
  HANDLE hMutex;
  LPCSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpName == (LPCSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    local_2c = 0x57;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","OpenMutexA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x1b9);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_2c = 0x32;
  }
  if (local_2c != 0) {
    CorUnix::CPalThread::SetLastError(local_2c);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (HANDLE)0x0;
}

Assistant:

HANDLE
PALAPI
OpenMutexA (
       IN DWORD dwDesiredAccess,
       IN BOOL bInheritHandle,
       IN LPCSTR lpName)
{
    HANDLE hMutex = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(OpenMutexA);
    ENTRY("OpenMutexA(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%s))\n",
          dwDesiredAccess, bInheritHandle, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }

    LOGEXIT("OpenMutexA returns HANDLE %p\n", hMutex);
    PERF_EXIT(OpenMutexA);
    return hMutex;
}